

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aa_warmup.c
# Opt level: O3

int test(LIBSSH2_SESSION *session)

{
  int type;
  size_t len;
  uint local_1c;
  undefined8 local_18;
  
  local_18 = 0;
  local_1c = 0;
  libssh2_session_hostkey(session,&local_18,&local_1c);
  fprintf(_stdout,"libssh2_session_hostkey returned len, type: %ld, %d\n",local_18,(ulong)local_1c);
  return 0;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    size_t len = 0;
    int type = 0;
    const char *hostkey = libssh2_session_hostkey(session, &len, &type);

    (void)hostkey;

    fprintf(stdout,
            "libssh2_session_hostkey returned len, type: %ld, %d\n",
            (long)len, type);

    return 0;  /* always return success */
}